

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qc_hash.c
# Opt level: O3

void * qc_hashtbl_enumnext(QcHashTbl *hashtbl)

{
  uint uVar1;
  void *pvVar2;
  HashEntry *pHVar3;
  uint uVar4;
  
  pHVar3 = hashtbl->cur_entry;
  if (pHVar3 == (HashEntry *)0x0) {
    uVar4 = hashtbl->cur_bucket_no;
    do {
      uVar1 = uVar4 + 1;
      if (hashtbl->bucket_count <= uVar1) {
        hashtbl->cur_bucket_no = uVar4 + 1;
        return (void *)0x0;
      }
      pHVar3 = hashtbl->pp_bucket[uVar1];
      hashtbl->cur_entry = pHVar3;
      uVar4 = uVar1;
    } while (pHVar3 == (HashEntry *)0x0);
    hashtbl->cur_bucket_no = uVar1;
  }
  pvVar2 = pHVar3->data;
  hashtbl->cur_entry = pHVar3->next;
  return pvVar2;
}

Assistant:

void* qc_hashtbl_enumnext(QcHashTbl *hashtbl)
{
    void *data;

	while(NULL == hashtbl->cur_entry)
	{
		hashtbl->cur_bucket_no += 1;
		if(hashtbl->cur_bucket_no >= hashtbl->bucket_count)
		{
			return NULL;
		}
		hashtbl->cur_entry = hashtbl->pp_bucket[hashtbl->cur_bucket_no];
	}

	data = hashtbl->cur_entry->data;

    hashtbl->cur_entry = hashtbl->cur_entry->next;

    return data;
}